

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool op_s_rrr_shi(DisasContext_conflict1 *s,arg_s_rrr_shi *a,
                  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict1 *gen,int logic_cc,
                  StoreRegKind kind)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  _Bool _Var2;
  TCGTemp *ts;
  TCGTemp *pTVar3;
  TCGv_i32 var;
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o_1;
  TCGv_i32 var_00;
  
  s_00 = s->uc->tcg_ctx;
  iVar1 = a->rm;
  ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  var = (TCGv_i32)((long)ts - (long)s_00);
  load_reg_var(s,var,iVar1);
  gen_arm_shift_im(s_00,var,a->shty,a->shim,logic_cc);
  iVar1 = a->rn;
  s_01 = s->uc->tcg_ctx;
  pTVar3 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
  var_00 = (TCGv_i32)((long)pTVar3 - (long)s_01);
  load_reg_var(s,var_00,iVar1);
  (*gen)(s_00,var_00,var_00,var);
  tcg_temp_free_internal_aarch64(s_00,ts);
  if (logic_cc != 0) {
    if (s_00->cpu_NF != var_00) {
      tcg_gen_op2_aarch64(s_00,INDEX_op_mov_i32,(TCGArg)(s_00->cpu_NF + (long)s_00),
                          (TCGArg)((long)s_00 + (long)var_00));
    }
    if (s_00->cpu_ZF != var_00) {
      tcg_gen_op2_aarch64(s_00,INDEX_op_mov_i32,(TCGArg)(s_00->cpu_ZF + (long)s_00),
                          (TCGArg)((long)s_00 + (long)var_00));
    }
  }
  _Var2 = store_reg_kind(s,a->rd,var_00,kind);
  return _Var2;
}

Assistant:

static bool op_s_rrr_shi(DisasContext *s, arg_s_rrr_shi *a,
                         void (*gen)(TCGContext *, TCGv_i32, TCGv_i32, TCGv_i32),
                         int logic_cc, StoreRegKind kind)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp1, tmp2;

    tmp2 = load_reg(s, a->rm);
    gen_arm_shift_im(tcg_ctx, tmp2, a->shty, a->shim, logic_cc);
    tmp1 = load_reg(s, a->rn);

    gen(tcg_ctx, tmp1, tmp1, tmp2);
    tcg_temp_free_i32(tcg_ctx, tmp2);

    if (logic_cc) {
        gen_logic_CC(tcg_ctx, tmp1);
    }
    return store_reg_kind(s, a->rd, tmp1, kind);
}